

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLReader::getUpToCharOrWS(XMLReader *this,XMLBuffer *toFill,XMLCh toCheck)

{
  bool bVar1;
  XMLCh local_24;
  XMLCh local_22;
  XMLCh curCh;
  XMLBuffer *pXStack_20;
  XMLCh toCheck_local;
  XMLBuffer *toFill_local;
  XMLReader *this_local;
  
  local_22 = toCheck;
  pXStack_20 = toFill;
  toFill_local = (XMLBuffer *)this;
  while( true ) {
    while (this->fCharsAvail <= this->fCharIndex) {
      bVar1 = refreshCharBuffer(this);
      if (!bVar1) {
        return false;
      }
    }
    local_24 = this->fCharBuf[this->fCharIndex];
    bVar1 = isWhitespace(this,local_24);
    if ((bVar1) || (local_24 == local_22)) break;
    this->fCharIndex = this->fCharIndex + 1;
    if ((local_24 & 0xdf52U) == 0) {
      handleEOL(this,&local_24,false);
    }
    else {
      this->fCurCol = this->fCurCol + 1;
    }
    XMLBuffer::append(pXStack_20,local_24);
  }
  return true;
}

Assistant:

bool XMLReader::getUpToCharOrWS(XMLBuffer& toFill, const XMLCh toCheck)
{
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its not a white space or our target char, then process
            //  it. Else, we need to return.
            //
            if (!isWhitespace(curCh) && (curCh != toCheck))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is not a whitespace(x20|x9|xD|xA), so we only can
                //  have end-of-line combinations with a leading chNEL(x85) or
                //  chLineSeparator(x2028)
                //
                //  0010000000101000 chLineSeparator
                //  0000000010000101 chNEL
                //  ---------------------
                //  1101111101010010 == ~(chNEL|chLineSeparator)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' can not be chNEL or chLineSeparator
                //  false : 'curCh' can be chNEL or chLineSeparator
                //
                if ( curCh & (XMLCh) ~(chNEL|chLineSeparator) )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Add it to our buffer
                toFill.append(curCh);
            }
             else
            {
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }

    // We never hit any non-space and ate up the whole reader
    return false;

}